

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::update_value(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  int *piVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pOVar5;
  iterator iVar6;
  pointer puVar7;
  long lVar8;
  pointer puVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *p;
  pointer pvVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  unsigned_long *puVar15;
  uint uVar16;
  uint j;
  uint uVar17;
  uint uVar18;
  pointer puVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  vector<unsigned_int,_std::allocator<unsigned_int>_> range;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->value_).vertex_,(vector<int,_std::allocator<int>_> *)this);
  pvVar3 = (this->value_).partition_.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (this->value_).partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar3; pvVar10 = pvVar10 + 1
      ) {
    puVar4 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar4) {
      (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
    }
  }
  uVar12 = (ulong)this->k_;
  uVar14 = 0;
  while( true ) {
    pOVar5 = (this->o_its_).
             super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_70,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((ulong)*(uint *)(*(long *)&pOVar5[uVar12].value_.p_it_.value_.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + uVar14 * 4) * 0x18 + *(long *)&pOVar5[uVar12].value_.s_it_.value_)
              );
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&this->t_);
    puVar9 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar18 = this->k_;
    uVar12 = (ulong)uVar18;
    puVar19 = (this->i_it_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (_Var11._M_current != puVar9) break;
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
    uVar17 = puVar19[uVar12];
    if (uVar17 < uVar13) {
LAB_00124f79:
      uVar13 = (int)uVar14 + 1;
      uVar16 = 0;
      local_48 = uVar14;
      if (uVar13 <= uVar17) {
        uVar16 = 0;
        do {
          pOVar5 = (this->o_its_).
                   super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_70,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((ulong)*(uint *)(*(long *)&pOVar5[uVar12].value_.p_it_.value_.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      + (ulong)uVar13 * 4) * 0x18 +
                     *(long *)&pOVar5[uVar12].value_.s_it_.value_));
          puVar9 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_50 = CONCAT44(local_50._4_4_,uVar13);
            puVar19 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_54 = uVar16;
            do {
              uVar12 = (ulong)*(uint *)(*(long *)&(this->simplex_).partition_.
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->k_].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data +
                                       (ulong)*puVar19 * 8);
              this_00 = (this->value_).partition_.
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar16;
              iVar6._M_current =
                   (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              local_38 = uVar12;
              if (iVar6._M_current ==
                  (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>(this_00,iVar6,&local_38);
              }
              else {
                *iVar6._M_current = uVar12;
                (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              piVar1 = (this->value_).vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar12;
              *piVar1 = *piVar1 + -1;
              puVar19 = puVar19 + 1;
            } while (puVar19 != puVar9);
            uVar13 = (uint)local_50;
            uVar16 = local_54;
          }
          if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
            operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_70.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_70.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar16 = uVar16 + 1;
          uVar13 = uVar13 + 1;
          uVar18 = this->k_;
          uVar12 = (ulong)uVar18;
        } while (uVar13 <= (this->i_it_).value_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12]);
      }
      if (uVar18 != 0) {
        uVar12 = 0;
        do {
          local_50 = uVar12 * 0x138;
          uVar14 = 0;
          local_40 = uVar12;
          do {
            pOVar5 = (this->o_its_).
                     super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_70,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((ulong)*(uint *)(*(long *)((long)&(pOVar5->value_).p_it_.value_ + local_50)
                                        + uVar14 * 4) * 0x18 +
                       *(long *)((long)&(pOVar5->value_).s_it_.value_ + local_50)));
            puVar9 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar18 = uVar16;
            if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              puVar19 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_54 = uVar16;
              do {
                puVar15 = (unsigned_long *)
                          ((ulong)*puVar19 * 8 +
                          *(long *)&(this->simplex_).partition_.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data);
                pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                         ((this->value_).partition_.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar16);
                iVar6._M_current = *(unsigned_long **)(pvVar2 + 8);
                if (iVar6._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar6,puVar15);
                }
                else {
                  *iVar6._M_current = *puVar15;
                  *(unsigned_long **)(pvVar2 + 8) = iVar6._M_current + 1;
                }
                puVar19 = puVar19 + 1;
                uVar18 = local_54;
              } while (puVar19 != puVar9);
            }
            if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
              operator_delete(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_70.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            uVar17 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar17;
            uVar16 = uVar18 + 1;
          } while (uVar17 <= (this->i_it_).value_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[local_40]);
          uVar12 = local_40 + 1;
        } while (uVar12 < this->k_);
      }
      uVar14 = 0;
      uVar12 = local_48;
      do {
        pOVar5 = (this->o_its_).
                 super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_70,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((ulong)*(uint *)(*(long *)&pOVar5[this->k_].value_.p_it_.value_.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                    + uVar14 * 4) * 0x18 +
                   *(long *)&pOVar5[this->k_].value_.s_it_.value_));
        puVar9 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          puVar19 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          do {
            puVar15 = (unsigned_long *)
                      ((ulong)*puVar19 * 8 +
                      *(long *)&(this->simplex_).partition_.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->k_].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data);
            pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                     ((this->value_).partition_.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar16);
            iVar6._M_current = *(unsigned_long **)(pvVar2 + 8);
            if (iVar6._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar6,puVar15);
            }
            else {
              *iVar6._M_current = *puVar15;
              *(unsigned_long **)(pvVar2 + 8) = iVar6._M_current + 1;
            }
            puVar19 = puVar19 + 1;
            uVar12 = local_48;
          } while (puVar19 != puVar9);
        }
        if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar18 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar18;
        uVar16 = uVar16 + 1;
      } while (uVar18 <= (uint)uVar12);
      pvVar3 = (this->value_).partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar10 = (this->value_).partition_.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar3;
          pvVar10 = pvVar10 + 1) {
        puVar4 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar7 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar4 != puVar7) {
          uVar12 = (long)puVar7 - (long)puVar4 >> 3;
          lVar8 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar8 == 0; lVar8 = lVar8 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar4,puVar7,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar4,puVar7);
        }
      }
      return;
    }
  }
  uVar17 = puVar19[uVar12];
  goto LAB_00124f79;
}

Assistant:

void update_value() {
    value_.vertex() = simplex_.vertex();
    for (auto& p : value_.partition()) p.clear();
    uint u_ = 0;  // the part in o_its_[k_] that contains t_
    for (; u_ <= (*i_it_)[k_]; u_++) {
      auto range = (*o_its_[k_])[u_];
      if (std::find(range.begin(), range.end(), t_) != range.end()) break;
    }
    uint i = 0;
    for (uint j = u_ + 1; j <= (*i_it_)[k_]; j++, i++)
      for (uint b : (*o_its_[k_])[j]) {
        uint c = simplex_.partition()[k_][b];
        value_.partition()[i].push_back(c);
        value_.vertex()[c]--;
      }
    for (uint h = 0; h < k_; h++)
      for (uint j = 0; j <= (*i_it_)[h]; j++, i++) {
        for (uint b : (*o_its_[h])[j]) value_.partition()[i].push_back(simplex_.partition()[h][b]);
      }
    for (uint j = 0; j <= u_; j++, i++)
      for (uint b : (*o_its_[k_])[j]) value_.partition()[i].push_back(simplex_.partition()[k_][b]);
    // sort the values in each part (probably not needed)
    for (auto& part : value_.partition()) std::sort(part.begin(), part.end());
  }